

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::func<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  bool bVar1;
  Name *pNVar2;
  Err *pEVar3;
  Ok *__u;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *pvVar4;
  ImportNames *pIVar5;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_389;
  Err local_388;
  Err *local_368;
  Err *err_5;
  bool local_358;
  undefined7 uStack_357;
  size_t sStack_350;
  undefined1 local_340 [8];
  Result<wasm::Ok> _val_5;
  string local_310;
  Err local_2f0;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> local_2d0;
  Err local_2b8;
  Err *local_298;
  Err *err_4;
  Result<wasm::Ok> _val_4;
  Err *err_3;
  MaybeResult<wasm::Ok> _val_3;
  MaybeResult<wasm::Ok> l;
  undefined1 local_1e8 [6];
  optional<wasm::Ok> localVars;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Result<wasm::Ok> type;
  Err *err_1;
  MaybeResult<wasm::WATParser::ImportNames> _val_1;
  MaybeResult<wasm::WATParser::ImportNames> import;
  Err *err;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> _val;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  optional<wasm::Name> id;
  Name name;
  undefined1 local_38 [8];
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> annotations;
  size_t pos;
  ParseDeclsCtx *ctx_local;
  
  annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Lexer::getPos(&ctx->in);
  Lexer::getAnnotations
            ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             local_38,&ctx->in);
  expected = sv("func",4);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    goto LAB_02329d23;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&exports.val.
                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),&ctx->in)
  ;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&exports.val.
                             super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  if (bVar1) {
    pNVar2 = std::optional<wasm::Name>::operator*
                       ((optional<wasm::Name> *)
                        ((long)&exports.val.
                                super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar2);
  }
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                ((long)&_val.val.
                        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                        .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),&ctx->in)
  ;
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)&err,
             (Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             ((long)&_val.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
  pEVar3 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::getErr
                     ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)&err);
  if (pEVar3 != (Err *)0x0) {
    wasm::Err::Err((Err *)((long)&import.val.
                                  super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                          + 0x20),pEVar3);
    MaybeResult<wasm::Ok>::MaybeResult
              (__return_storage_ptr__,
               (Err *)((long)&import.val.
                              super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                      + 0x20));
    wasm::Err::~Err((Err *)((long)&import.val.
                                   super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           + 0x20));
  }
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)&err);
  if (pEVar3 == (Err *)0x0) {
    inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)
                 ((long)&_val_1.val.
                         super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                 + 0x20),&ctx->in);
    MaybeResult<wasm::WATParser::ImportNames>::MaybeResult
              ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1,
               (MaybeResult<wasm::WATParser::ImportNames> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20));
    pEVar3 = MaybeResult<wasm::WATParser::ImportNames>::getErr
                       ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
    if (pEVar3 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar3);
      MaybeResult<wasm::Ok>::MaybeResult
                (__return_storage_ptr__,
                 (Err *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
              ((MaybeResult<wasm::WATParser::ImportNames> *)&err_1);
    if (pEVar3 == (Err *)0x0) {
      typeuse<wasm::WATParser::ParseDeclsCtx>
                ((Result<wasm::Ok> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx,true);
      Result<wasm::Ok>::Result
                ((Result<wasm::Ok> *)&err_2,
                 (Result<wasm::Ok> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      pEVar3 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      if (pEVar3 != (Err *)0x0) {
        wasm::Err::Err((Err *)local_1e8,pEVar3);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,(Err *)local_1e8);
        wasm::Err::~Err((Err *)local_1e8);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (pEVar3 == (Err *)0x0) {
        std::optional<wasm::Ok>::optional
                  ((optional<wasm::Ok> *)
                   ((long)&l.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x26));
        bVar1 = wasm::MaybeResult::operator_cast_to_bool
                          ((MaybeResult *)
                           ((long)&_val_1.val.
                                   super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                           + 0x20));
        if (!bVar1) {
          locals<wasm::WATParser::ParseDeclsCtx>
                    ((MaybeResult<wasm::Ok> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
          bVar1 = wasm::MaybeResult::operator_cast_to_bool
                            ((MaybeResult *)
                             ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                     .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20)
                            );
          if (bVar1) {
            MaybeResult<wasm::Ok>::MaybeResult
                      ((MaybeResult<wasm::Ok> *)&err_3,
                       (MaybeResult<wasm::Ok> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
            pEVar3 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_3);
            bVar1 = pEVar3 != (Err *)0x0;
            if (bVar1) {
              wasm::Err::Err((Err *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                             pEVar3);
              MaybeResult<wasm::Ok>::MaybeResult
                        (__return_storage_ptr__,
                         (Err *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              wasm::Err::~Err((Err *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_3);
            if (!bVar1) {
              __u = MaybeResult<wasm::Ok>::operator*
                              ((MaybeResult<wasm::Ok> *)
                               ((long)&_val_3.val.
                                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                               0x20));
              std::optional<wasm::Ok>::operator=
                        ((optional<wasm::Ok> *)
                         ((long)&l.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x26),__u
                        );
              goto LAB_023298ba;
            }
          }
          else {
LAB_023298ba:
            bVar1 = false;
          }
          MaybeResult<wasm::Ok>::~MaybeResult
                    ((MaybeResult<wasm::Ok> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
          if (bVar1) goto LAB_02329ccf;
          bVar1 = NullTypeParserCtx::skipFunctionBody((NullTypeParserCtx *)ctx);
          if (!bVar1) {
            instrs<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)&err_4,ctx);
            local_298 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_4);
            bVar1 = local_298 != (Err *)0x0;
            if (bVar1) {
              wasm::Err::Err(&local_2b8,local_298);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2b8);
              wasm::Err::~Err(&local_2b8);
            }
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_4);
            if (bVar1) goto LAB_02329ccf;
            Lexer::takeAnnotations(&local_2d0,&ctx->in);
            NullInstrParserCtx::setSrcLoc((NullInstrParserCtx *)ctx,&local_2d0);
            std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
            ~vector(&local_2d0);
          }
        }
        bVar1 = NullTypeParserCtx::skipFunctionBody((NullTypeParserCtx *)ctx);
        if ((bVar1) || (bVar1 = Lexer::takeRParen(&ctx->in), bVar1)) {
          local_358 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>._M_engaged;
          uStack_357 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._17_7_;
          sStack_350 = name.super_IString.str._M_len;
          pvVar4 = Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::operator*
                             ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
                              ((long)&_val.val.
                                      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                                      .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                                      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                                      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> +
                              0x20));
          pIVar5 = MaybeResult<wasm::WATParser::ImportNames>::getPtr
                             ((MaybeResult<wasm::WATParser::ImportNames> *)
                              ((long)&_val_1.val.
                                      super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                              + 0x20));
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          err_5._4_2_ = l.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._38_2_;
          ParseDeclsCtx::addFunc
                    (local_340,ctx,_local_358,sStack_350,pvVar4,pIVar5,
                     l.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._38_2_,local_38,
                     annotations.
                     super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
          local_368 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_340);
          bVar1 = local_368 == (Err *)0x0;
          if (!bVar1) {
            wasm::Err::Err(&local_388,local_368);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_388);
            wasm::Err::~Err(&local_388);
          }
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_340);
          if (bVar1) {
            MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_389);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_310,"expected end of function",
                     (allocator<char> *)
                     ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
          Lexer::err(&local_2f0,&ctx->in,&local_310);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2f0);
          wasm::Err::~Err(&local_2f0);
          std::__cxx11::string::~string((string *)&local_310);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        }
      }
LAB_02329ccf:
      Result<wasm::Ok>::~Result
                ((Result<wasm::Ok> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    MaybeResult<wasm::WATParser::ImportNames>::~MaybeResult
              ((MaybeResult<wasm::WATParser::ImportNames> *)
               ((long)&_val_1.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> +
               0x20));
  }
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::~Result
            ((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)
             ((long)&_val.val.
                     super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                     super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
LAB_02329d23:
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::~vector
            ((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *)
             local_38);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> func(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  auto annotations = ctx.in.getAnnotations();

  if (!ctx.in.takeSExprStart("func"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto type = typeuse(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::LocalsT> localVars;
  if (!import) {
    if (auto l = locals(ctx)) {
      CHECK_ERR(l);
      localVars = *l;
    }
    if (!ctx.skipFunctionBody()) {
      CHECK_ERR(instrs(ctx));
      ctx.setSrcLoc(ctx.in.takeAnnotations());
    }
  }

  if (!ctx.skipFunctionBody() && !ctx.in.takeRParen()) {
    return ctx.in.err("expected end of function");
  }

  CHECK_ERR(ctx.addFunc(name,
                        *exports,
                        import.getPtr(),
                        *type,
                        localVars,
                        std::move(annotations),
                        pos));
  return Ok{};
}